

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O3

void __thiscall
fmp4_stream::ingest_stream::patch_tfdt
          (ingest_stream *this,uint64_t time_anchor,bool applytimescale,uint32_t anchor_scale)

{
  long lVar1;
  uint32_t uVar2;
  pointer pmVar3;
  pointer pmVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  if ((int)CONCAT71(in_register_00000011,applytimescale) == 0) {
    pmVar3 = (this->media_fragment_).
             super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pmVar4 = (this->media_fragment_).
             super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pmVar4 != pmVar3) {
      uVar2 = *(int *)&pmVar4[-1].mfhd_.super_full_box.field_0x6c + 1;
      goto LAB_00115064;
    }
  }
  else {
    uVar2 = init_fragment::get_time_scale(&this->init_fragment_);
    if (uVar2 != 0) {
      time_anchor = (uVar2 * time_anchor) / (ulong)anchor_scale;
    }
    pmVar3 = (this->media_fragment_).
             super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pmVar4 = (this->media_fragment_).
             super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  uVar2 = 0;
LAB_00115064:
  if (pmVar4 != pmVar3) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      media_fragment::patch_tfdt(pmVar3 + uVar5,time_anchor,uVar2);
      pmVar3 = (this->media_fragment_).
               super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->media_fragment_).
                     super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3 >> 3) *
              0x1cac083126e978d5;
      uVar2 = uVar2 + 1;
      bVar7 = uVar6 <= uVar5;
      lVar1 = uVar5 - uVar6;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar7 && lVar1 != 0);
  }
  return;
}

Assistant:

void ingest_stream::patch_tfdt(uint64_t time_anchor, bool applytimescale, uint32_t anchor_scale)
	{
		if (applytimescale) {
			uint32_t timescale = 0;
			timescale = this->init_fragment_.get_time_scale();
			if(timescale)
			   time_anchor = time_anchor * timescale / anchor_scale; // offset to add to the timestamps
		}

		uint32_t seq_nr = 0;
		
		// only patch sequence number in the case when no timescale is applied 
		if (media_fragment_.size() && !applytimescale)
			seq_nr = 1 + this->media_fragment_[media_fragment_.size()-1].mfhd_.seq_nr_;

		for (uint32_t i = 0; i < this->media_fragment_.size(); i++)
		{
				this->media_fragment_[i].patch_tfdt(time_anchor, seq_nr + i);
		}	
	}